

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O1

void test_bson_writer_null_realloc(void)

{
  char cVar1;
  undefined8 uVar2;
  int *extraout_RDX;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint8_t *buf;
  bson_t *b;
  size_t buflen;
  undefined8 uStack_68;
  char *pcStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined1 *puStack_48;
  code *pcStack_40;
  char *local_30;
  undefined1 local_28 [8];
  undefined8 local_20;
  
  pcStack_40 = (code *)0x13693c;
  local_30 = (char *)bson_malloc0(0x20);
  local_20 = 0x20;
  pcStack_40 = (code *)0x13695c;
  uVar2 = bson_writer_new(&local_30,&local_20,0,0,0);
  uVar5 = 6;
  do {
    pcStack_40 = (code *)0x136974;
    cVar1 = bson_writer_begin(uVar2,local_28);
    if (cVar1 == '\0') {
      pcStack_40 = (code *)0x1369e2;
      test_bson_writer_null_realloc_cold_1();
      goto LAB_001369e2;
    }
    pcStack_40 = (code *)0x136980;
    bson_writer_end(uVar2);
    uVar3 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar3;
  } while (uVar3 != 0);
  pcStack_40 = (code *)0x136991;
  cVar1 = bson_writer_begin(uVar2,local_28);
  if (cVar1 == '\0') {
    auVar8[0] = -(local_30[0x10] == '\0');
    auVar8[1] = -(local_30[0x11] == '\0');
    auVar8[2] = -(local_30[0x12] == '\0');
    auVar8[3] = -(local_30[0x13] == '\0');
    auVar8[4] = -(local_30[0x14] == '\x05');
    auVar8[5] = -(local_30[0x15] == '\0');
    auVar8[6] = -(local_30[0x16] == '\0');
    auVar8[7] = -(local_30[0x17] == '\0');
    auVar8[8] = -(local_30[0x18] == '\0');
    auVar8[9] = -(local_30[0x19] == '\x05');
    auVar8[10] = -(local_30[0x1a] == '\0');
    auVar8[0xb] = -(local_30[0x1b] == '\0');
    auVar8[0xc] = -(local_30[0x1c] == '\0');
    auVar8[0xd] = -(local_30[0x1d] == '\0');
    auVar8[0xe] = -(local_30[0x1e] == '\0');
    auVar8[0xf] = -(local_30[0x1f] == '\0');
    auVar6[0] = -(*local_30 == '\x05');
    auVar6[1] = -(local_30[1] == '\0');
    auVar6[2] = -(local_30[2] == '\0');
    auVar6[3] = -(local_30[3] == '\0');
    auVar6[4] = -(local_30[4] == '\0');
    auVar6[5] = -(local_30[5] == '\x05');
    auVar6[6] = -(local_30[6] == '\0');
    auVar6[7] = -(local_30[7] == '\0');
    auVar6[8] = -(local_30[8] == '\0');
    auVar6[9] = -(local_30[9] == '\0');
    auVar6[10] = -(local_30[10] == '\x05');
    auVar6[0xb] = -(local_30[0xb] == '\0');
    auVar6[0xc] = -(local_30[0xc] == '\0');
    auVar6[0xd] = -(local_30[0xd] == '\0');
    auVar6[0xe] = -(local_30[0xe] == '\0');
    auVar6[0xf] = -(local_30[0xf] == '\x05');
    auVar6 = auVar6 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      pcStack_40 = (code *)0x1369ca;
      bson_writer_destroy(uVar2);
      pcStack_40 = (code *)0x1369d4;
      bson_free(local_30);
      return;
    }
  }
  else {
LAB_001369e2:
    pcStack_40 = (code *)0x1369e7;
    test_bson_writer_null_realloc_cold_3();
  }
  pcStack_40 = test_bson_writer_null_realloc_2;
  test_bson_writer_null_realloc_cold_2();
  uStack_50 = uVar2;
  puStack_48 = local_28;
  pcStack_40 = (code *)uVar5;
  pcStack_60 = (char *)bson_malloc0(0x20);
  uStack_58 = 0x20;
  uVar2 = bson_writer_new(&pcStack_60,&uStack_58,0,0,0);
  iVar4 = 5;
  do {
    cVar1 = bson_writer_begin(uVar2,&uStack_68);
    if (cVar1 == '\0') {
      test_bson_writer_null_realloc_2_cold_1();
      goto LAB_00136acf;
    }
    bson_writer_end(uVar2);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  cVar1 = bson_writer_begin(uVar2,&uStack_68);
  if (cVar1 == '\0') {
LAB_00136acf:
    test_bson_writer_null_realloc_2_cold_2();
  }
  else {
    cVar1 = bson_append_int32(uStack_68,"a",0xffffffff,0x7b);
    if (cVar1 == '\0') {
      bson_writer_end(uVar2);
      auVar9[0] = -(pcStack_60[0x10] == '\0');
      auVar9[1] = -(pcStack_60[0x11] == '\0');
      auVar9[2] = -(pcStack_60[0x12] == '\0');
      auVar9[3] = -(pcStack_60[0x13] == '\0');
      auVar9[4] = -(pcStack_60[0x14] == '\x05');
      auVar9[5] = -(pcStack_60[0x15] == '\0');
      auVar9[6] = -(pcStack_60[0x16] == '\0');
      auVar9[7] = -(pcStack_60[0x17] == '\0');
      auVar9[8] = -(pcStack_60[0x18] == '\0');
      auVar9[9] = -(pcStack_60[0x19] == '\x05');
      auVar9[10] = -(pcStack_60[0x1a] == '\0');
      auVar9[0xb] = -(pcStack_60[0x1b] == '\0');
      auVar9[0xc] = -(pcStack_60[0x1c] == '\0');
      auVar9[0xd] = -(pcStack_60[0x1d] == '\0');
      auVar9[0xe] = -(pcStack_60[0x1e] == '\0');
      auVar9[0xf] = -(pcStack_60[0x1f] == '\0');
      auVar7[0] = -(*pcStack_60 == '\x05');
      auVar7[1] = -(pcStack_60[1] == '\0');
      auVar7[2] = -(pcStack_60[2] == '\0');
      auVar7[3] = -(pcStack_60[3] == '\0');
      auVar7[4] = -(pcStack_60[4] == '\0');
      auVar7[5] = -(pcStack_60[5] == '\x05');
      auVar7[6] = -(pcStack_60[6] == '\0');
      auVar7[7] = -(pcStack_60[7] == '\0');
      auVar7[8] = -(pcStack_60[8] == '\0');
      auVar7[9] = -(pcStack_60[9] == '\0');
      auVar7[10] = -(pcStack_60[10] == '\x05');
      auVar7[0xb] = -(pcStack_60[0xb] == '\0');
      auVar7[0xc] = -(pcStack_60[0xc] == '\0');
      auVar7[0xd] = -(pcStack_60[0xd] == '\0');
      auVar7[0xe] = -(pcStack_60[0xe] == '\0');
      auVar7[0xf] = -(pcStack_60[0xf] == '\x05');
      auVar7 = auVar7 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
        bson_writer_destroy(uVar2);
        bson_free(pcStack_60);
        return;
      }
      goto LAB_00136ad9;
    }
  }
  test_bson_writer_null_realloc_2_cold_4();
LAB_00136ad9:
  test_bson_writer_null_realloc_2_cold_3();
  *extraout_RDX = *extraout_RDX + 1;
  bson_realloc();
  return;
}

Assistant:

static void
test_bson_writer_null_realloc (void)
{
   const uint8_t testdata[] = {5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5,
                               0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 0, 0};
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   size_t buflen = 32;
   bson_t *b;
   int r;
   int i;

   writer = bson_writer_new (&buf, &buflen, 0, NULL, NULL);
   for (i = 0; i < 6; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));
      bson_writer_end (writer);
   }

   BSON_ASSERT (!bson_writer_begin (writer, &b));

   r = memcmp (buf, testdata, 32);
   BSON_ASSERT (r == 0);
   bson_writer_destroy (writer);

   bson_free (buf);
}